

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

SegmentBuilder * __thiscall capnp::_::BuilderArena::getSegment(BuilderArena *this,SegmentId id)

{
  MultiSegmentState *pMVar1;
  Own<capnp::_::SegmentBuilder> *pOVar2;
  SegmentBuilder *pSVar3;
  SegmentId id_local;
  Fault f;
  
  if (id.value == 0) {
    pSVar3 = &this->segment0;
  }
  else {
    pMVar1 = (this->moreSegments).ptr.ptr;
    id_local = id;
    if (pMVar1 == (MultiSegmentState *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],unsigned_int&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xb1,FAILED,(char *)0x0,"\"invalid segment id\", id.value",
                 (char (*) [19])"invalid segment id",&id_local.value);
      kj::_::Debug::Fault::fatal(&f);
    }
    pOVar2 = (pMVar1->builders).builder.ptr;
    if ((ulong)((long)(pMVar1->builders).builder.pos - (long)pOVar2 >> 4) <= (ulong)(id.value - 1))
    {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],unsigned_int&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
                 ,0xae,FAILED,"id.value - 1 < s->get()->builders.size()",
                 "\"invalid segment id\", id.value",(char (*) [19])"invalid segment id",
                 &id_local.value);
      kj::_::Debug::Fault::fatal(&f);
    }
    pSVar3 = pOVar2[id.value - 1].ptr;
  }
  return pSVar3;
}

Assistant:

SegmentBuilder* BuilderArena::getSegment(SegmentId id) {
  // This method is allowed to fail if the segment ID is not valid.
  if (id == SegmentId(0)) {
    return &segment0;
  } else {
    KJ_IF_MAYBE(s, moreSegments) {
      KJ_REQUIRE(id.value - 1 < s->get()->builders.size(), "invalid segment id", id.value);
      return const_cast<SegmentBuilder*>(s->get()->builders[id.value - 1].get());
    } else {
      KJ_FAIL_REQUIRE("invalid segment id", id.value);
    }
  }